

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::AdvancedBindingUpdate::Setup(AdvancedBindingUpdate *this)

{
  AdvancedBindingUpdate *this_local;
  
  glu::CallLogWrapper::glGenVertexArrays
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,2,this->m_vao);
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,2,this->m_vbo);
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,2,this->m_ebo);
  if ((this->pipeline & 1U) == 0) {
    this->m_ppo = 0;
  }
  else {
    this->m_fsp = 0;
    this->m_vsp = 0;
    glu::CallLogWrapper::glGenProgramPipelines
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_ppo);
  }
  return 0;
}

Assistant:

virtual long Setup()
	{
		glGenVertexArrays(2, m_vao);
		glGenBuffers(2, m_vbo);
		glGenBuffers(2, m_ebo);
		if (pipeline)
		{
			m_vsp = m_fsp = 0;
			glGenProgramPipelines(1, &m_ppo);
		}
		else
		{
			m_ppo = 0;
		}
		return NO_ERROR;
	}